

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::StartTestCase(BasicReporter *this,TestCaseInfo *testInfo)

{
  string *spanName;
  SpanInfo local_40;
  TestCaseInfo *local_18;
  TestCaseInfo *testInfo_local;
  BasicReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestCaseInfo *)this;
  spanName = TestCaseInfo::getName_abi_cxx11_(testInfo);
  SpanInfo::SpanInfo(&local_40,spanName);
  SpanInfo::operator=(&this->m_testSpan,&local_40);
  SpanInfo::~SpanInfo(&local_40);
  return;
}

Assistant:

virtual void StartTestCase( const TestCaseInfo& testInfo ) {
            m_testSpan = testInfo.getName();
        }